

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

string * google::protobuf::internal::StringTypeHandler::New_abi_cxx11_(Arena *arena)

{
  Arena *arena_local;
  string *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  
  if (arena == (Arena *)0x0) {
    local_28 = (string *)operator_new(0x20);
    std::__cxx11::string::string((string *)local_28);
  }
  else {
    local_28 = (string *)
               Arena::AllocateAligned(arena,(type_info *)&std::__cxx11::string::typeinfo,0x20);
    std::__cxx11::string::string((string *)local_28);
    Arena::AddListNode(arena,local_28,arena_destruct_object<std::__cxx11::string>);
  }
  return local_28;
}

Assistant:

static inline string* New(Arena* arena) {
    return Arena::Create<string>(arena);
  }